

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simplewidgets.cpp
# Opt level: O1

State __thiscall QAccessibleGroupBox::state(QAccessibleGroupBox *this)

{
  bool bVar1;
  bool bVar2;
  State SVar3;
  QWidget *pQVar4;
  
  SVar3 = QAccessibleWidget::state(&this->super_QAccessibleWidget);
  pQVar4 = QAccessibleWidget::widget(&this->super_QAccessibleWidget);
  bVar1 = QGroupBox::isCheckable((QGroupBox *)pQVar4);
  pQVar4 = QAccessibleWidget::widget(&this->super_QAccessibleWidget);
  bVar2 = QGroupBox::isChecked((QGroupBox *)pQVar4);
  return (State)((ulong)SVar3 & 0xffffffff9f | (ulong)bVar1 << 5 | (ulong)bVar2 << 6 |
                0xaaaaaa0000000000);
}

Assistant:

QAccessible::State QAccessibleGroupBox::state() const
{
    QAccessible::State st = QAccessibleWidget::state();
    st.checkable = groupBox()->isCheckable();
    st.checked = groupBox()->isChecked();
    return st;
}